

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O1

void secp256k1_scalar_inverse_var(secp256k1_scalar *r,secp256k1_scalar *x)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  bool bVar5;
  undefined4 extraout_EAX;
  int iVar6;
  uint uVar7;
  secp256k1_gej *psVar8;
  int64_t iVar9;
  int64_t iVar10;
  ulong uVar11;
  secp256k1_modinv64_signed62 *psVar12;
  byte bVar13;
  undefined4 uVar14;
  int iVar15;
  uint uVar16;
  secp256k1_gej *psVar17;
  secp256k1_gej *psVar18;
  ulong *extraout_RDX;
  long lVar19;
  long lVar20;
  long lVar21;
  secp256k1_modinv64_signed62 *a;
  long *extraout_RDX_00;
  secp256k1_modinv64_signed62 *b;
  secp256k1_gej *psVar22;
  secp256k1_gej *psVar23;
  secp256k1_gej *psVar24;
  long lVar25;
  secp256k1_gej *psVar26;
  secp256k1_gej *psVar27;
  secp256k1_gej *a_00;
  secp256k1_modinv64_signed62 *psVar28;
  secp256k1_modinv64_signed62 *psVar29;
  secp256k1_fe *a_01;
  secp256k1_gej *a_02;
  secp256k1_gej *psVar30;
  secp256k1_modinv64_signed62 *a_03;
  secp256k1_gej *psVar31;
  ulong uVar32;
  ulong uVar33;
  secp256k1_gej *psVar34;
  uint64_t *puVar35;
  long lVar36;
  undefined1 *puVar37;
  secp256k1_gej *psVar38;
  long lVar39;
  ulong uVar40;
  secp256k1_gej *psVar41;
  long lVar42;
  ulong uVar43;
  ulong uVar44;
  long lVar45;
  bool bVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  secp256k1_modinv64_signed62 s;
  secp256k1_modinv64_signed62 sStack_330;
  secp256k1_modinv64_signed62 sStack_308;
  secp256k1_gej *psStack_2e0;
  secp256k1_gej *psStack_2d8;
  secp256k1_gej *psStack_2d0;
  ulong uStack_2c8;
  secp256k1_gej *psStack_2c0;
  ulong uStack_2b8;
  secp256k1_gej *psStack_2b0;
  secp256k1_gej *psStack_2a8;
  long lStack_2a0;
  secp256k1_gej *psStack_298;
  secp256k1_gej *psStack_290;
  secp256k1_gej *psStack_288;
  uint64_t uStack_280;
  secp256k1_gej *psStack_278;
  secp256k1_gej *psStack_270;
  secp256k1_gej *psStack_268;
  secp256k1_gej *psStack_260;
  uint64_t uStack_258;
  secp256k1_gej *psStack_250;
  secp256k1_gej *psStack_248;
  secp256k1_gej *psStack_240;
  secp256k1_gej *psStack_238;
  secp256k1_gej *psStack_230;
  secp256k1_gej *psStack_228;
  long lStack_220;
  secp256k1_gej *psStack_218;
  code *pcStack_210;
  uint uStack_204;
  secp256k1_gej *psStack_200;
  secp256k1_gej *apsStack_1f8 [2];
  undefined1 auStack_1e8 [56];
  uint64_t uStack_1b0;
  uint64_t uStack_1a8;
  uint64_t uStack_1a0;
  uint64_t uStack_198;
  secp256k1_modinv64_trans2x2 sStack_188;
  undefined1 auStack_168 [96];
  ulong uStack_108;
  ulong uStack_100;
  secp256k1_gej *psStack_f8;
  ulong uStack_f0;
  secp256k1_gej *psStack_e8;
  secp256k1_gej *psStack_d8;
  secp256k1_gej *psStack_d0;
  secp256k1_gej *psStack_c0;
  secp256k1_fe *psStack_b8;
  secp256k1_fe sStack_b0;
  secp256k1_scalar *psStack_80;
  secp256k1_gej *psStack_78;
  code *pcStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  secp256k1_gej *local_38;
  
  pcStack_70 = (code *)0x14a93b;
  secp256k1_scalar_verify(x);
  local_68 = x->d[2] | x->d[0];
  uStack_60 = x->d[3] | x->d[1];
  pcStack_70 = (code *)0x14a953;
  secp256k1_scalar_verify(x);
  uVar40 = x->d[0];
  uVar43 = x->d[1];
  uVar11 = x->d[2];
  uVar32 = x->d[3];
  pcStack_70 = (code *)0x14a96a;
  secp256k1_scalar_verify(x);
  uVar14 = 0xffffffff;
  uVar44 = uVar40 & 0x3fffffffffffffff;
  uVar40 = (uVar43 & 0xfffffffffffffff) << 2 | uVar40 >> 0x3e;
  uVar43 = (uVar11 & 0x3ffffffffffffff) << 4 | uVar43 >> 0x3c;
  local_40 = (uVar32 & 0xffffffffffffff) << 6 | uVar11 >> 0x3a;
  psVar26 = (secp256k1_gej *)(uVar32 >> 0x38);
  pcStack_70 = (code *)0x14a9bd;
  local_58 = uVar44;
  local_50 = uVar40;
  local_48 = uVar43;
  local_38 = psVar26;
  secp256k1_modinv64_var
            ((secp256k1_modinv64_signed62 *)&stack0xffffffffffffffa8,&secp256k1_const_modinfo_scalar
            );
  pcStack_70 = (code *)0x14a9c8;
  psVar27 = (secp256k1_gej *)&stack0xffffffffffffffa8;
  secp256k1_scalar_from_signed62(r,(secp256k1_modinv64_signed62 *)&stack0xffffffffffffffa8);
  pcStack_70 = (code *)0x14a9d0;
  secp256k1_scalar_verify(r);
  pcStack_70 = (code *)0x14a9d8;
  a_01 = (secp256k1_fe *)r;
  secp256k1_scalar_verify(r);
  auVar47._0_4_ = -(uint)((int)r->d[2] == 0 && (int)r->d[0] == 0);
  auVar47._4_4_ = -(uint)(*(int *)((long)r->d + 0x14) == 0 && *(int *)((long)r->d + 4) == 0);
  auVar47._8_4_ = -(uint)((int)r->d[3] == 0 && (int)r->d[1] == 0);
  auVar47._12_4_ = -(uint)(*(int *)((long)r->d + 0x1c) == 0 && *(int *)((long)r->d + 0xc) == 0);
  iVar6 = movmskps(extraout_EAX,auVar47);
  auVar48._0_4_ = -(uint)((int)local_68 == 0);
  auVar48._4_4_ = -(uint)(local_68._4_4_ == 0);
  auVar48._8_4_ = -(uint)((int)uStack_60 == 0);
  auVar48._12_4_ = -(uint)(uStack_60._4_4_ == 0);
  iVar15 = movmskps(uVar14,auVar48);
  if ((iVar15 != 0xf) != (iVar6 == 0xf)) {
    return;
  }
  pcStack_70 = secp256k1_gej_eq_x_var;
  secp256k1_scalar_inverse_var_cold_1();
  psStack_b8 = (secp256k1_fe *)0x14aa34;
  psVar22 = psVar27;
  psStack_80 = r;
  psStack_78 = (secp256k1_gej *)&stack0xffffffffffffffa8;
  pcStack_70 = (code *)uVar44;
  secp256k1_fe_verify(a_01);
  psStack_b8 = (secp256k1_fe *)0x14aa3c;
  psVar30 = psVar27;
  secp256k1_gej_verify(psVar27);
  if (psVar27->infinity == 0) {
    psStack_b8 = (secp256k1_fe *)0x14aa54;
    secp256k1_fe_sqr(&sStack_b0,&psVar27->z);
    psStack_b8 = (secp256k1_fe *)0x14aa62;
    secp256k1_fe_mul(&sStack_b0,&sStack_b0,a_01);
    psStack_b8 = (secp256k1_fe *)0x14aa6d;
    secp256k1_fe_equal(&sStack_b0,&psVar27->x);
    return;
  }
  psStack_b8 = (secp256k1_fe *)secp256k1_fe_cmp_var;
  secp256k1_gej_eq_x_var_cold_1();
  psStack_d0 = (secp256k1_gej *)0x14aa8b;
  psVar18 = psVar22;
  psStack_c0 = psVar27;
  psStack_b8 = a_01;
  secp256k1_fe_verify(&psVar30->x);
  psStack_d0 = (secp256k1_gej *)0x14aa93;
  psVar27 = psVar22;
  secp256k1_fe_verify(&psVar22->x);
  if ((psVar30->x).normalized == 0) {
    psStack_d0 = (secp256k1_gej *)0x14aad5;
    secp256k1_fe_cmp_var_cold_2();
  }
  else if ((psVar22->x).normalized != 0) {
    uVar7 = 4;
    while( true ) {
      uVar40 = (psVar22->x).n[uVar7];
      uVar43 = (psVar30->x).n[uVar7];
      if (uVar43 >= uVar40 && uVar43 != uVar40) {
        return;
      }
      if (uVar43 < uVar40) break;
      bVar46 = uVar7 == 0;
      uVar7 = uVar7 - 1;
      if (bVar46) {
        return;
      }
    }
    return;
  }
  psStack_d0 = (secp256k1_gej *)secp256k1_fe_add;
  secp256k1_fe_cmp_var_cold_1();
  psStack_e8 = (secp256k1_gej *)0x14aae9;
  psVar23 = psVar18;
  psStack_d8 = psVar22;
  psStack_d0 = psVar30;
  secp256k1_fe_verify(&psVar27->x);
  psStack_e8 = (secp256k1_gej *)0x14aaf1;
  psVar22 = psVar18;
  secp256k1_fe_verify(&psVar18->x);
  iVar6 = (psVar18->x).magnitude + (psVar27->x).magnitude;
  if (iVar6 < 0x21) {
    (psVar27->x).n[0] = (psVar27->x).n[0] + (psVar18->x).n[0];
    puVar35 = (psVar27->x).n + 1;
    *puVar35 = *puVar35 + (psVar18->x).n[1];
    puVar35 = (psVar27->x).n + 2;
    *puVar35 = *puVar35 + (psVar18->x).n[2];
    puVar35 = (psVar27->x).n + 3;
    *puVar35 = *puVar35 + (psVar18->x).n[3];
    puVar35 = (psVar27->x).n + 4;
    *puVar35 = *puVar35 + (psVar18->x).n[4];
    (psVar27->x).magnitude = iVar6;
    (psVar27->x).normalized = 0;
    secp256k1_fe_verify(&psVar27->x);
    return;
  }
  psStack_e8 = (secp256k1_gej *)secp256k1_modinv64_var;
  secp256k1_fe_add_cold_1();
  psStack_e8 = psVar26;
  uStack_f0 = uVar44;
  psStack_f8 = psVar18;
  uStack_100 = uVar43;
  uStack_108 = uVar40;
  auStack_168._88_8_ = psVar27;
  auStack_168._16_8_ = 0;
  auStack_168._24_8_ = 0;
  auStack_168._0_8_ = 0;
  auStack_168._8_8_ = 0;
  psVar27 = (secp256k1_gej *)0x0;
  auStack_168._32_8_ = 0;
  auStack_168._56_8_ = 0;
  auStack_168._80_8_ = 0;
  auStack_168._64_8_ = 0;
  auStack_168._72_8_ = 0;
  auStack_168._48_8_ = 1;
  uStack_198 = (psVar23->x).n[4];
  uStack_1a8 = (psVar23->x).n[2];
  uStack_1a0 = (psVar23->x).n[3];
  auStack_1e8._48_8_ = (secp256k1_gej *)(psVar23->x).n[0];
  uStack_1b0 = (psVar23->x).n[1];
  auStack_1e8._32_8_ = (psVar22->x).n[4];
  auStack_1e8._0_8_ = (psVar22->x).n[0];
  auStack_1e8._8_8_ = (psVar22->x).n[1];
  psStack_200 = psVar22;
  auStack_1e8._16_8_ = (psVar22->x).n[2];
  auStack_1e8._24_8_ = (psVar22->x).n[3];
  lVar45 = -1;
  psVar22 = (secp256k1_gej *)0x5;
  apsStack_1f8[0] = psVar23;
  do {
    psVar30 = (secp256k1_gej *)auStack_1e8._48_8_;
    psVar24 = apsStack_1f8[0];
    uStack_204 = (uint)psVar22;
    psVar8 = (secp256k1_gej *)0x0;
    psVar34 = (secp256k1_gej *)0x0;
    psVar31 = (secp256k1_gej *)0x1;
    uVar7 = 0x3e;
    a_00 = (secp256k1_gej *)0x1;
    puVar37 = (undefined1 *)auStack_1e8._0_8_;
    psVar18 = (secp256k1_gej *)auStack_1e8._48_8_;
    while( true ) {
      a_02 = (secp256k1_gej *)(-1L << ((byte)uVar7 & 0x3f) | (ulong)puVar37);
      psVar17 = (secp256k1_gej *)0x0;
      if (a_02 != (secp256k1_gej *)0x0) {
        for (; ((ulong)a_02 >> (long)psVar17 & 1) == 0;
            psVar17 = (secp256k1_gej *)((long)(psVar17->x).n + 1)) {
        }
      }
      bVar13 = (byte)psVar17;
      psVar38 = (secp256k1_gej *)((ulong)puVar37 >> (bVar13 & 0x3f));
      a_00 = (secp256k1_gej *)((long)a_00 << (bVar13 & 0x3f));
      psVar8 = (secp256k1_gej *)((long)psVar8 << (bVar13 & 0x3f));
      lVar45 = lVar45 - (long)psVar17;
      uVar7 = uVar7 - (int)psVar17;
      apsStack_1f8[1] = psVar27;
      if (uVar7 == 0) break;
      if (((ulong)psVar18 & 1) == 0) {
        pcStack_210 = (code *)0x14b063;
        secp256k1_modinv64_var_cold_8();
LAB_0014b063:
        pcStack_210 = (code *)0x14b068;
        secp256k1_modinv64_var_cold_7();
LAB_0014b068:
        pcStack_210 = (code *)0x14b06d;
        secp256k1_modinv64_var_cold_1();
LAB_0014b06d:
        pcStack_210 = (code *)0x14b072;
        secp256k1_modinv64_var_cold_2();
LAB_0014b072:
        pcStack_210 = (code *)0x14b077;
        secp256k1_modinv64_var_cold_6();
        psVar38 = psVar18;
        goto LAB_0014b077;
      }
      if (((ulong)psVar38 & 1) == 0) goto LAB_0014b063;
      a_02 = (secp256k1_gej *)((long)psVar8 * auStack_1e8._0_8_ + (long)a_00 * auStack_1e8._48_8_);
      psVar17 = (secp256k1_gej *)(ulong)(0x3e - uVar7);
      bVar13 = (byte)(0x3e - uVar7);
      psVar22 = (secp256k1_gej *)((long)psVar18 << (bVar13 & 0x3f));
      if (a_02 != psVar22) goto LAB_0014b068;
      psVar22 = (secp256k1_gej *)
                ((long)psVar31 * auStack_1e8._0_8_ + (long)psVar34 * auStack_1e8._48_8_);
      a_02 = (secp256k1_gej *)((long)psVar38 << (bVar13 & 0x3f));
      if (psVar22 != a_02) goto LAB_0014b06d;
      psVar17 = (secp256k1_gej *)(lVar45 - 0x2ea);
      if (psVar17 < (secp256k1_gej *)0xfffffffffffffa2d) goto LAB_0014b072;
      iVar6 = (int)psVar38;
      if (lVar45 < 0) {
        lVar45 = -lVar45;
        uVar16 = (int)lVar45 + 1;
        if ((int)uVar7 <= (int)uVar16) {
          uVar16 = uVar7;
        }
        psVar17 = (secp256k1_gej *)(ulong)uVar16;
        a_02 = (secp256k1_gej *)(ulong)(uVar16 - 0x3f);
        if (0xffffffc1 < uVar16 - 0x3f) {
          psVar41 = (secp256k1_gej *)-(long)psVar8;
          psVar26 = (secp256k1_gej *)-(long)a_00;
          psVar17 = (secp256k1_gej *)-(long)psVar18;
          psVar22 = (secp256k1_gej *)
                    ((ulong)(0x3fL << (-(char)uVar16 & 0x3fU)) >> (-(char)uVar16 & 0x3fU));
          uVar16 = (iVar6 * iVar6 + 0x3e) * iVar6 * (int)psVar17 & (uint)psVar22;
          psVar8 = psVar31;
          a_00 = psVar34;
          psVar23 = psVar41;
          goto LAB_0014ad3d;
        }
        goto LAB_0014b081;
      }
      uVar16 = (int)lVar45 + 1;
      if ((int)uVar7 <= (int)uVar16) {
        uVar16 = uVar7;
      }
      psVar17 = (secp256k1_gej *)(ulong)uVar16;
      a_02 = (secp256k1_gej *)(ulong)(uVar16 - 0x3f);
      if (uVar16 - 0x3f < 0xffffffc2) goto LAB_0014b07c;
      psVar22 = (secp256k1_gej *)
                ((ulong)(0xfL << (-(char)uVar16 & 0x3fU)) >> (-(char)uVar16 & 0x3fU));
      uVar16 = -(iVar6 * (((int)psVar18 * 2 + 2U & 8) + (int)psVar18)) & (uint)psVar22;
      psVar26 = psVar34;
      psVar41 = psVar31;
      psVar17 = psVar38;
      psVar38 = psVar18;
LAB_0014ad3d:
      uVar40 = (ulong)uVar16;
      a_02 = (secp256k1_gej *)(uVar40 * (long)psVar38);
      puVar37 = (undefined1 *)((long)(psVar17->x).n + (long)(a_02->x).n);
      psVar34 = (secp256k1_gej *)((long)(psVar26->x).n + (long)a_00 * uVar40);
      psVar17 = (secp256k1_gej *)(uVar40 * (long)psVar8);
      psVar31 = (secp256k1_gej *)((long)(psVar41->x).n + (long)(psVar17->x).n);
      psVar18 = psVar38;
      if (((ulong)puVar37 & (ulong)psVar22) != 0) {
LAB_0014b077:
        pcStack_210 = (code *)0x14b07c;
        secp256k1_modinv64_var_cold_4();
        psVar18 = psVar38;
LAB_0014b07c:
        pcStack_210 = (code *)0x14b081;
        secp256k1_modinv64_var_cold_3();
LAB_0014b081:
        pcStack_210 = (code *)0x14b086;
        secp256k1_modinv64_var_cold_5();
        goto LAB_0014b086;
      }
    }
    a_02 = (secp256k1_gej *)((long)psVar8 * (long)psVar34);
    psVar17 = SUB168(SEXT816((long)psVar8) * SEXT816((long)psVar34),8);
    sStack_188.u = (int64_t)a_00;
    sStack_188.v = (int64_t)psVar8;
    sStack_188.q = (int64_t)psVar34;
    sStack_188.r = (int64_t)psVar31;
    if ((long)a_00 * (long)psVar31 - (long)a_02 != 0x4000000000000000 ||
        SUB168(SEXT816((long)a_00) * SEXT816((long)psVar31),8) - (long)psVar17 !=
        (ulong)((secp256k1_gej *)((long)a_00 * (long)psVar31) < a_02)) {
LAB_0014b086:
      pcStack_210 = (code *)0x14b08b;
      secp256k1_modinv64_var_cold_9();
      psVar24 = psVar23;
LAB_0014b08b:
      pcStack_210 = (code *)0x14b090;
      secp256k1_modinv64_var_cold_20();
LAB_0014b090:
      pcStack_210 = (code *)0x14b095;
      secp256k1_modinv64_var_cold_19();
LAB_0014b095:
      pcStack_210 = (code *)0x14b09a;
      secp256k1_modinv64_var_cold_18();
      psVar27 = psVar30;
LAB_0014b09a:
      pcStack_210 = (code *)0x14b09f;
      secp256k1_modinv64_var_cold_17();
LAB_0014b09f:
      pcStack_210 = (code *)0x14b0a4;
      secp256k1_modinv64_var_cold_14();
LAB_0014b0a4:
      pcStack_210 = (code *)0x14b0a9;
      secp256k1_modinv64_var_cold_13();
LAB_0014b0a9:
      pcStack_210 = (code *)0x14b0ae;
      secp256k1_modinv64_var_cold_12();
LAB_0014b0ae:
      pcStack_210 = (code *)0x14b0b3;
      secp256k1_modinv64_var_cold_11();
LAB_0014b0b3:
      pcStack_210 = (code *)0x14b0b8;
      secp256k1_modinv64_var_cold_10();
      goto LAB_0014b0b8;
    }
    pcStack_210 = (code *)0x14adcb;
    secp256k1_modinv64_update_de_62
              ((secp256k1_modinv64_signed62 *)auStack_168,
               (secp256k1_modinv64_signed62 *)(auStack_168 + 0x30),&sStack_188,
               (secp256k1_modinv64_modinfo *)apsStack_1f8[0]);
    uVar7 = uStack_204;
    psVar18 = (secp256k1_gej *)(auStack_1e8 + 0x30);
    psVar22 = (secp256k1_gej *)(ulong)uStack_204;
    a_00 = (secp256k1_gej *)(ulong)uStack_204;
    psVar17 = (secp256k1_gej *)0xffffffffffffffff;
    pcStack_210 = (code *)0x14ade8;
    a_02 = psVar18;
    iVar6 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar18,uStack_204,
                       (secp256k1_modinv64_signed62 *)psVar24,-1);
    if (iVar6 < 1) goto LAB_0014b08b;
    psVar17 = (secp256k1_gej *)0x1;
    a_00 = (secp256k1_gej *)(ulong)uVar7;
    pcStack_210 = (code *)0x14ae02;
    a_02 = psVar18;
    iVar6 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar18,uVar7,
                       (secp256k1_modinv64_signed62 *)psVar24,1);
    if (0 < iVar6) goto LAB_0014b090;
    psVar30 = (secp256k1_gej *)auStack_1e8;
    a_00 = (secp256k1_gej *)(ulong)uVar7;
    psVar17 = (secp256k1_gej *)0xffffffffffffffff;
    pcStack_210 = (code *)0x14ae23;
    a_02 = psVar30;
    iVar6 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar30,uVar7,
                       (secp256k1_modinv64_signed62 *)psVar24,-1);
    if (iVar6 < 1) goto LAB_0014b095;
    psVar17 = (secp256k1_gej *)0x1;
    a_00 = (secp256k1_gej *)(ulong)uVar7;
    pcStack_210 = (code *)0x14ae3d;
    a_02 = psVar30;
    iVar6 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar30,uVar7,
                       (secp256k1_modinv64_signed62 *)psVar24,1);
    psVar27 = psVar30;
    if (-1 < iVar6) goto LAB_0014b09a;
    pcStack_210 = (code *)0x14ae5a;
    secp256k1_modinv64_update_fg_62_var
              (uVar7,(secp256k1_modinv64_signed62 *)psVar18,(secp256k1_modinv64_signed62 *)psVar30,
               &sStack_188);
    psVar27 = apsStack_1f8[1];
    if ((undefined1 *)auStack_1e8._0_8_ != (undefined1 *)0x0) {
LAB_0014ae6b:
      lVar19 = (long)(int)uVar7;
      uVar40 = *(ulong *)(auStack_1e8 + lVar19 * 8 + 0x28);
      psVar17 = apsStack_1f8[lVar19 + 1];
      a_02 = (secp256k1_gej *)((long)uVar40 >> 0x3f ^ uVar40 | lVar19 + -2 >> 0x3f);
      a_00 = (secp256k1_gej *)((long)psVar17 >> 0x3f ^ (ulong)psVar17 | (ulong)a_02);
      if (a_00 == (secp256k1_gej *)0x0) {
        psVar22 = (secp256k1_gej *)(ulong)(uVar7 - 1);
        *(ulong *)(auStack_1e8 + lVar19 * 8 + 0x20) =
             *(ulong *)(auStack_1e8 + lVar19 * 8 + 0x20) | uVar40 << 0x3e;
        psVar17 = (secp256k1_gej *)((long)psVar17 << 0x3e);
        apsStack_1f8[lVar19] = (secp256k1_gej *)((ulong)apsStack_1f8[lVar19] | (ulong)psVar17);
      }
      if (10 < (int)psVar27) goto LAB_0014b09f;
      psVar17 = (secp256k1_gej *)0xffffffffffffffff;
      pcStack_210 = (code *)0x14aece;
      iVar15 = (int)psVar22;
      a_00 = psVar22;
      a_02 = psVar18;
      iVar6 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)psVar18,iVar15,
                         (secp256k1_modinv64_signed62 *)psVar24,-1);
      if (iVar6 < 1) goto LAB_0014b0a4;
      psVar17 = (secp256k1_gej *)0x1;
      pcStack_210 = (code *)0x14aee8;
      a_00 = psVar22;
      a_02 = psVar18;
      iVar6 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)psVar18,iVar15,
                         (secp256k1_modinv64_signed62 *)psVar24,1);
      if (0 < iVar6) goto LAB_0014b0a9;
      psVar18 = (secp256k1_gej *)auStack_1e8;
      psVar17 = (secp256k1_gej *)0xffffffffffffffff;
      pcStack_210 = (code *)0x14af09;
      a_00 = psVar22;
      a_02 = psVar18;
      iVar6 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)psVar18,iVar15,
                         (secp256k1_modinv64_signed62 *)psVar24,-1);
      if (iVar6 < 1) goto LAB_0014b0ae;
      psVar17 = (secp256k1_gej *)0x1;
      pcStack_210 = (code *)0x14af23;
      a_00 = psVar22;
      a_02 = psVar18;
      iVar6 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)psVar18,iVar15,
                         (secp256k1_modinv64_signed62 *)psVar24,1);
      if (iVar6 < 0) {
        bVar46 = true;
        psVar27 = (secp256k1_gej *)(ulong)((int)psVar27 + 1);
        goto LAB_0014af58;
      }
      goto LAB_0014b0b3;
    }
    if (1 < (int)uVar7) {
      uVar40 = 1;
      uVar43 = 0;
      do {
        uVar43 = uVar43 | *(ulong *)(auStack_1e8 + uVar40 * 8);
        uVar40 = uVar40 + 1;
      } while (uVar7 != uVar40);
      if (uVar43 != 0) goto LAB_0014ae6b;
    }
    bVar46 = false;
LAB_0014af58:
    psVar23 = psVar24;
  } while (bVar46);
  a_02 = (secp256k1_gej *)auStack_1e8;
  iVar15 = (int)psVar22;
  psVar17 = (secp256k1_gej *)0x0;
  pcStack_210 = (code *)0x14af75;
  a_00 = psVar22;
  iVar6 = secp256k1_modinv64_mul_cmp_62
                    ((secp256k1_modinv64_signed62 *)a_02,iVar15,&SECP256K1_SIGNED62_ONE,0);
  if (iVar6 == 0) {
    pcStack_210 = (code *)0x14af97;
    iVar6 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)(auStack_1e8 + 0x30),iVar15,
                       &SECP256K1_SIGNED62_ONE,-1);
    psVar27 = psStack_200;
    if (iVar6 == 0) {
LAB_0014b019:
      pcStack_210 = (code *)0x14b034;
      secp256k1_modinv64_normalize_62
                ((secp256k1_modinv64_signed62 *)auStack_168,
                 *(int64_t *)(auStack_1e8 + (long)iVar15 * 8 + 0x28),
                 (secp256k1_modinv64_modinfo *)psVar24);
      (psVar27->x).n[4] = auStack_168._32_8_;
      (psVar27->x).n[2] = auStack_168._16_8_;
      (psVar27->x).n[3] = auStack_168._24_8_;
      (psVar27->x).n[0] = auStack_168._0_8_;
      (psVar27->x).n[1] = auStack_168._8_8_;
      return;
    }
    pcStack_210 = (code *)0x14afb8;
    iVar6 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)(auStack_1e8 + 0x30),iVar15,
                       &SECP256K1_SIGNED62_ONE,1);
    if (iVar6 == 0) goto LAB_0014b019;
    a_00 = (secp256k1_gej *)0x5;
    psVar17 = (secp256k1_gej *)0x0;
    pcStack_210 = (code *)0x14afd2;
    a_02 = psVar27;
    iVar6 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar27,5,&SECP256K1_SIGNED62_ONE,0);
    if (iVar6 == 0) {
      a_02 = (secp256k1_gej *)auStack_168;
      a_00 = (secp256k1_gej *)0x5;
      psVar17 = (secp256k1_gej *)0x0;
      pcStack_210 = (code *)0x14aff5;
      iVar6 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)a_02,5,&SECP256K1_SIGNED62_ONE,0);
      if (iVar6 == 0) {
        a_02 = (secp256k1_gej *)(auStack_1e8 + 0x30);
        psVar17 = (secp256k1_gej *)0x1;
        pcStack_210 = (code *)0x14b011;
        a_00 = psVar22;
        iVar6 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)a_02,iVar15,
                           (secp256k1_modinv64_signed62 *)psVar24,1);
        if (iVar6 == 0) goto LAB_0014b019;
      }
    }
  }
  else {
LAB_0014b0b8:
    pcStack_210 = (code *)0x14b0bd;
    secp256k1_modinv64_var_cold_15();
  }
  pcStack_210 = secp256k1_scalar_from_signed62;
  secp256k1_modinv64_var_cold_16();
  uVar40 = (a_00->x).n[0];
  if (uVar40 >> 0x3e == 0) {
    uVar43 = (a_00->x).n[1];
    if (0x3fffffffffffffff < uVar43) goto LAB_0014b14c;
    psVar17 = (secp256k1_gej *)(a_00->x).n[2];
    if ((secp256k1_gej *)0x3fffffffffffffff < psVar17) goto LAB_0014b151;
    uVar11 = (a_00->x).n[3];
    if (0x3fffffffffffffff < uVar11) goto LAB_0014b156;
    a_00 = (secp256k1_gej *)(a_00->x).n[4];
    if (a_00 < (secp256k1_gej *)&DAT_00000100) {
      (a_02->x).n[0] = uVar43 << 0x3e | uVar40;
      (a_02->x).n[1] = (long)psVar17 << 0x3c | uVar43 >> 2;
      (a_02->x).n[2] = uVar11 << 0x3a | (ulong)psVar17 >> 4;
      (a_02->x).n[3] = (long)a_00 << 0x38 | uVar11 >> 6;
      secp256k1_scalar_verify((secp256k1_scalar *)a_02);
      return;
    }
  }
  else {
    psStack_218 = (secp256k1_gej *)0x14b14c;
    secp256k1_scalar_from_signed62_cold_5();
LAB_0014b14c:
    psStack_218 = (secp256k1_gej *)0x14b151;
    secp256k1_scalar_from_signed62_cold_4();
LAB_0014b151:
    psStack_218 = (secp256k1_gej *)0x14b156;
    secp256k1_scalar_from_signed62_cold_3();
LAB_0014b156:
    psStack_218 = (secp256k1_gej *)0x14b15b;
    secp256k1_scalar_from_signed62_cold_2();
  }
  psStack_218 = (secp256k1_gej *)secp256k1_modinv64_update_de_62;
  secp256k1_scalar_from_signed62_cold_1();
  psStack_218 = psVar26;
  lStack_220 = lVar45;
  psStack_228 = psVar27;
  psStack_230 = psVar18;
  psStack_238 = psVar24;
  psStack_240 = psVar22;
  uVar1 = (a_02->x).n[0];
  psStack_250 = (secp256k1_gej *)(a_02->x).n[1];
  psStack_260 = (secp256k1_gej *)(a_02->x).n[2];
  uStack_280 = (a_02->x).n[3];
  psStack_270 = (secp256k1_gej *)(a_02->x).n[4];
  psVar26 = (secp256k1_gej *)(a_00->x).n[0];
  psStack_248 = (secp256k1_gej *)(a_00->x).n[1];
  uStack_258 = (a_00->x).n[2];
  uStack_2b8 = *extraout_RDX;
  psStack_2b0 = (secp256k1_gej *)extraout_RDX[1];
  uStack_2c8 = extraout_RDX[2];
  psStack_2c0 = (secp256k1_gej *)extraout_RDX[3];
  psVar27 = (secp256k1_gej *)(a_00->x).n[3];
  psStack_278 = (secp256k1_gej *)(a_00->x).n[4];
  psVar22 = (secp256k1_gej *)0x5;
  psVar18 = (secp256k1_gej *)0xfffffffffffffffe;
  psStack_2d0 = (secp256k1_gej *)0x14b1fc;
  psVar30 = a_02;
  iVar6 = secp256k1_modinv64_mul_cmp_62
                    ((secp256k1_modinv64_signed62 *)a_02,5,(secp256k1_modinv64_signed62 *)psVar17,-2
                    );
  if (iVar6 < 1) {
    psStack_2d0 = (secp256k1_gej *)0x14bd1c;
    secp256k1_modinv64_update_de_62_cold_34();
LAB_0014bd1c:
    psStack_2d0 = (secp256k1_gej *)0x14bd21;
    secp256k1_modinv64_update_de_62_cold_33();
LAB_0014bd21:
    psStack_2d0 = (secp256k1_gej *)0x14bd26;
    secp256k1_modinv64_update_de_62_cold_32();
LAB_0014bd26:
    psStack_2d0 = (secp256k1_gej *)0x14bd2b;
    secp256k1_modinv64_update_de_62_cold_31();
LAB_0014bd2b:
    psStack_2d0 = (secp256k1_gej *)0x14bd30;
    secp256k1_modinv64_update_de_62_cold_30();
LAB_0014bd30:
    psStack_2d0 = (secp256k1_gej *)0x14bd35;
    secp256k1_modinv64_update_de_62_cold_29();
LAB_0014bd35:
    psStack_2d0 = (secp256k1_gej *)0x14bd3a;
    secp256k1_modinv64_update_de_62_cold_1();
LAB_0014bd3a:
    psStack_2d0 = (secp256k1_gej *)0x14bd3f;
    secp256k1_modinv64_update_de_62_cold_2();
    psVar23 = psVar17;
LAB_0014bd3f:
    psStack_2d0 = (secp256k1_gej *)0x14bd44;
    secp256k1_modinv64_update_de_62_cold_3();
LAB_0014bd44:
    psStack_2d0 = (secp256k1_gej *)0x14bd49;
    secp256k1_modinv64_update_de_62_cold_4();
LAB_0014bd49:
    psStack_2d0 = (secp256k1_gej *)0x14bd4e;
    secp256k1_modinv64_update_de_62_cold_5();
    psVar24 = psVar23;
LAB_0014bd4e:
    psStack_2d0 = (secp256k1_gej *)0x14bd53;
    secp256k1_modinv64_update_de_62_cold_6();
LAB_0014bd53:
    psStack_2d0 = (secp256k1_gej *)0x14bd58;
    secp256k1_modinv64_update_de_62_cold_7();
LAB_0014bd58:
    psStack_2d0 = (secp256k1_gej *)0x14bd5d;
    secp256k1_modinv64_update_de_62_cold_8();
LAB_0014bd5d:
    psStack_2d0 = (secp256k1_gej *)0x14bd62;
    secp256k1_modinv64_update_de_62_cold_11();
LAB_0014bd62:
    psStack_2d0 = (secp256k1_gej *)0x14bd67;
    secp256k1_modinv64_update_de_62_cold_12();
LAB_0014bd67:
    psStack_2d0 = (secp256k1_gej *)0x14bd6c;
    secp256k1_modinv64_update_de_62_cold_15();
LAB_0014bd6c:
    psStack_2d0 = (secp256k1_gej *)0x14bd71;
    secp256k1_modinv64_update_de_62_cold_16();
LAB_0014bd71:
    psStack_2d0 = (secp256k1_gej *)0x14bd76;
    secp256k1_modinv64_update_de_62_cold_19();
LAB_0014bd76:
    psStack_2d0 = (secp256k1_gej *)0x14bd7b;
    secp256k1_modinv64_update_de_62_cold_20();
LAB_0014bd7b:
    psStack_2d0 = (secp256k1_gej *)0x14bd80;
    secp256k1_modinv64_update_de_62_cold_21();
LAB_0014bd80:
    psVar27 = psVar26;
    a_00 = a_02;
    psStack_2d0 = (secp256k1_gej *)0x14bd85;
    secp256k1_modinv64_update_de_62_cold_22();
LAB_0014bd85:
    psStack_2d0 = (secp256k1_gej *)0x14bd8a;
    secp256k1_modinv64_update_de_62_cold_28();
LAB_0014bd8a:
    psStack_2d0 = (secp256k1_gej *)0x14bd8f;
    secp256k1_modinv64_update_de_62_cold_27();
LAB_0014bd8f:
    psStack_2d0 = (secp256k1_gej *)0x14bd94;
    secp256k1_modinv64_update_de_62_cold_26();
LAB_0014bd94:
    psStack_2d0 = (secp256k1_gej *)0x14bd99;
    secp256k1_modinv64_update_de_62_cold_25();
LAB_0014bd99:
    psStack_2d0 = (secp256k1_gej *)0x14bd9e;
    secp256k1_modinv64_update_de_62_cold_24();
LAB_0014bd9e:
    psStack_2d0 = (secp256k1_gej *)0x14bda3;
    secp256k1_modinv64_update_de_62_cold_23();
    a_02 = a_00;
    psVar8 = psVar27;
LAB_0014bda3:
    psStack_2d0 = (secp256k1_gej *)0x14bda8;
    secp256k1_modinv64_update_de_62_cold_9();
LAB_0014bda8:
    psStack_2d0 = (secp256k1_gej *)0x14bdad;
    secp256k1_modinv64_update_de_62_cold_10();
LAB_0014bdad:
    psStack_2d0 = (secp256k1_gej *)0x14bdb2;
    secp256k1_modinv64_update_de_62_cold_13();
LAB_0014bdb2:
    psVar23 = psVar18;
    psStack_2d0 = (secp256k1_gej *)0x14bdb7;
    secp256k1_modinv64_update_de_62_cold_14();
LAB_0014bdb7:
    uVar7 = (uint)psVar22;
    psStack_2d0 = (secp256k1_gej *)0x14bdbc;
    secp256k1_modinv64_update_de_62_cold_17();
  }
  else {
    psVar18 = (secp256k1_gej *)0x1;
    psVar22 = (secp256k1_gej *)0x5;
    psStack_2d0 = (secp256k1_gej *)0x14b219;
    psVar30 = a_02;
    iVar6 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)a_02,5,(secp256k1_modinv64_signed62 *)psVar17,
                       1);
    if (-1 < iVar6) goto LAB_0014bd1c;
    psVar22 = (secp256k1_gej *)0x5;
    psVar18 = (secp256k1_gej *)0xfffffffffffffffe;
    psStack_2d0 = (secp256k1_gej *)0x14b238;
    psVar30 = a_00;
    iVar6 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)a_00,5,(secp256k1_modinv64_signed62 *)psVar17,
                       -2);
    if (iVar6 < 1) goto LAB_0014bd21;
    psVar18 = (secp256k1_gej *)0x1;
    psVar22 = (secp256k1_gej *)0x5;
    psStack_2d0 = (secp256k1_gej *)0x14b255;
    psVar30 = a_00;
    iVar6 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)a_00,5,(secp256k1_modinv64_signed62 *)psVar17,
                       1);
    if (-1 < iVar6) goto LAB_0014bd26;
    psStack_2d0 = (secp256k1_gej *)0x14b27b;
    psStack_290 = a_02;
    psStack_268 = psVar27;
    iVar9 = secp256k1_modinv64_abs(uStack_2b8);
    psStack_2d0 = (secp256k1_gej *)0x14b288;
    psVar30 = psStack_2b0;
    iVar10 = secp256k1_modinv64_abs((int64_t)psStack_2b0);
    psVar18 = (secp256k1_gej *)(0x4000000000000000 - iVar10);
    a_02 = (secp256k1_gej *)0x3fffffffffffffff;
    if ((long)psVar18 < iVar9) goto LAB_0014bd2b;
    psStack_2d0 = (secp256k1_gej *)0x14b2a3;
    iVar9 = secp256k1_modinv64_abs(uStack_2c8);
    psStack_2d0 = (secp256k1_gej *)0x14b2b0;
    psVar30 = psStack_2c0;
    iVar10 = secp256k1_modinv64_abs((int64_t)psStack_2c0);
    psVar27 = psStack_290;
    psVar18 = (secp256k1_gej *)(0x4000000000000000 - iVar10);
    if ((long)psVar18 < iVar9) goto LAB_0014bd30;
    a_02 = (secp256k1_gej *)0x7fffffffffffffff;
    psVar22 = (secp256k1_gej *)(uStack_2b8 * uVar1);
    psVar18 = SUB168(SEXT816((long)uStack_2b8) * SEXT816((long)uVar1),8);
    uVar40 = (long)psStack_2b0 * (long)psVar26;
    lVar19 = SUB168(SEXT816((long)psStack_2b0) * SEXT816((long)psVar26),8);
    lVar45 = (0x7fffffffffffffff - lVar19) - (long)psVar18;
    if (-1 < lVar19 &&
        (SBORROW8(0x7fffffffffffffff - lVar19,(long)psVar18) !=
        SBORROW8(lVar45,(ulong)((secp256k1_gej *)~uVar40 < psVar22))) !=
        (long)(lVar45 - (ulong)((secp256k1_gej *)~uVar40 < psVar22)) < 0) goto LAB_0014bd35;
    puVar35 = (uint64_t *)((long)(psVar22->x).n + uVar40);
    lVar36 = (long)(psVar18->x).n + (ulong)CARRY8(uVar40,(ulong)psVar22) + lVar19;
    uVar43 = uStack_2c8 * uVar1;
    lVar20 = SUB168(SEXT816((long)uStack_2c8) * SEXT816((long)uVar1),8);
    uVar11 = (long)psStack_2c0 * (long)psVar26;
    lVar21 = SUB168(SEXT816((long)psStack_2c0) * SEXT816((long)psVar26),8);
    uVar40 = (ulong)(-uVar11 - 1 < uVar43);
    lVar45 = (0x7fffffffffffffff - lVar21) - lVar20;
    lVar19 = lVar45 - uVar40;
    bVar46 = (SBORROW8(0x7fffffffffffffff - lVar21,lVar20) != SBORROW8(lVar45,uVar40)) == lVar19 < 0
    ;
    psVar18 = (secp256k1_gej *)CONCAT71((int7)((ulong)lVar19 >> 8),lVar21 < 0 || bVar46);
    if (lVar21 >= 0 && !bVar46) goto LAB_0014bd3a;
    psVar23 = (secp256k1_gej *)((long)psStack_278 >> 0x3f);
    lStack_2a0 = ((ulong)psStack_2b0 & (ulong)psVar23) + (uStack_2b8 & (long)psStack_270 >> 0x3f);
    uVar32 = uVar11 + uVar43;
    psVar30 = (secp256k1_gej *)(lVar21 + lVar20 + (ulong)CARRY8(uVar11,uVar43));
    uVar1 = (psVar17->x).n[0];
    psVar22 = *(secp256k1_gej **)&(psVar17->x).magnitude;
    psVar18 = (secp256k1_gej *)0x3fffffffffffffff;
    lStack_2a0 = lStack_2a0 - ((long)psVar22 * (long)puVar35 + lStack_2a0 & 0x3fffffffffffffffU);
    uVar43 = lStack_2a0 * uVar1;
    lVar19 = SUB168(SEXT816(lStack_2a0) * SEXT816((long)uVar1),8);
    uVar40 = (ulong)((undefined1 *)(-uVar43 - 1) < puVar35);
    lVar45 = (0x7fffffffffffffff - lVar19) - lVar36;
    psVar26 = (secp256k1_gej *)((-0x8000000000000000 - lVar19) - (ulong)(uVar43 != 0));
    bVar46 = (SBORROW8(0x7fffffffffffffff - lVar19,lVar36) != SBORROW8(lVar45,uVar40)) ==
             (long)(lVar45 - uVar40) < 0;
    if (lVar19 < 0) {
      bVar46 = (SBORROW8(lVar36,(long)psVar26) !=
               SBORROW8(lVar36 - (long)psVar26,(ulong)(puVar35 < (undefined1 *)-uVar43))) ==
               (long)((lVar36 - (long)psVar26) - (ulong)(puVar35 < (undefined1 *)-uVar43)) < 0;
    }
    psStack_298 = a_00;
    psStack_288 = psVar17;
    if (!bVar46) goto LAB_0014bd3f;
    lVar45 = ((ulong)psVar23 & (ulong)psStack_2c0) + ((long)psStack_270 >> 0x3f & uStack_2c8);
    psVar23 = (secp256k1_gej *)(lVar45 - ((long)psVar22 * uVar32 + lVar45 & 0x3fffffffffffffff));
    lVar20 = lVar19 + lVar36 + (ulong)CARRY8(uVar43,(ulong)puVar35);
    uVar11 = (long)psVar23 * uVar1;
    lVar19 = SUB168(SEXT816((long)psVar23) * SEXT816((long)uVar1),8);
    uVar40 = (ulong)(-uVar11 - 1 < uVar32);
    lVar45 = (0x7fffffffffffffff - lVar19) - (long)psVar30;
    psVar22 = (secp256k1_gej *)((-0x8000000000000000 - lVar19) - (ulong)(uVar11 != 0));
    bVar46 = (SBORROW8(0x7fffffffffffffff - lVar19,(long)psVar30) != SBORROW8(lVar45,uVar40)) ==
             (long)(lVar45 - uVar40) < 0;
    if (lVar19 < 0) {
      bVar46 = (SBORROW8((long)psVar30,(long)psVar22) !=
               SBORROW8((long)psVar30 - (long)psVar22,(ulong)(uVar32 < -uVar11))) ==
               (long)(((long)psVar30 - (long)psVar22) - (ulong)(uVar32 < -uVar11)) < 0;
    }
    if (!bVar46) goto LAB_0014bd44;
    lVar45 = (long)(psVar30->x).n + (ulong)CARRY8(uVar11,uVar32) + lVar19;
    if (((long)puVar35 + uVar43 & 0x3fffffffffffffff) != 0) goto LAB_0014bd49;
    psVar24 = psVar23;
    if ((uVar11 + uVar32 & 0x3fffffffffffffff) != 0) goto LAB_0014bd4e;
    psVar24 = (secp256k1_gej *)0x8000000000000000;
    uVar40 = (ulong)((long)puVar35 + uVar43) >> 0x3e | lVar20 * 4;
    psVar18 = (secp256k1_gej *)0x7fffffffffffffff;
    uVar44 = uStack_2b8 * (long)psStack_250 + uVar40;
    psVar30 = (secp256k1_gej *)
              (SUB168(SEXT816((long)uStack_2b8) * SEXT816((long)psStack_250),8) + (lVar20 >> 0x3e) +
              (ulong)CARRY8(uStack_2b8 * (long)psStack_250,uVar40));
    uVar43 = (long)psStack_2b0 * (long)psStack_248;
    lVar21 = SUB168(SEXT816((long)psStack_2b0) * SEXT816((long)psStack_248),8);
    uVar40 = (ulong)(-uVar43 - 1 < uVar44);
    lVar19 = (0x7fffffffffffffff - lVar21) - (long)psVar30;
    lVar36 = (-0x8000000000000000 - lVar21) - (ulong)(uVar43 != 0);
    lVar20 = (long)psVar30 - lVar36;
    bVar46 = (SBORROW8(0x7fffffffffffffff - lVar21,(long)psVar30) != SBORROW8(lVar19,uVar40)) ==
             (long)(lVar19 - uVar40) < 0;
    if (lVar21 < 0) {
      bVar46 = (SBORROW8((long)psVar30,lVar36) != SBORROW8(lVar20,(ulong)(uVar44 < -uVar43))) ==
               (long)(lVar20 - (ulong)(uVar44 < -uVar43)) < 0;
    }
    psVar22 = (secp256k1_gej *)(ulong)bVar46;
    a_02 = psStack_250;
    psVar26 = psStack_248;
    psStack_2a8 = psVar23;
    if (bVar46 == false) goto LAB_0014bd53;
    uVar40 = uVar11 + uVar32 >> 0x3e | lVar45 * 4;
    uVar11 = uVar44 + uVar43;
    psVar30 = (secp256k1_gej *)((long)(psVar30->x).n + (ulong)CARRY8(uVar44,uVar43) + lVar21);
    uVar32 = uStack_2c8 * (long)psStack_250 + uVar40;
    lVar21 = SUB168(SEXT816((long)uStack_2c8) * SEXT816((long)psStack_250),8) + (lVar45 >> 0x3e) +
             (ulong)CARRY8(uStack_2c8 * (long)psStack_250,uVar40);
    uVar43 = (long)psStack_2c0 * (long)psStack_248;
    lVar20 = SUB168(SEXT816((long)psStack_2c0) * SEXT816((long)psStack_248),8);
    uVar40 = (ulong)(-uVar43 - 1 < uVar32);
    lVar45 = (0x7fffffffffffffff - lVar20) - lVar21;
    lVar36 = (-0x8000000000000000 - lVar20) - (ulong)(uVar43 != 0);
    lVar19 = lVar21 - lVar36;
    bVar46 = (SBORROW8(0x7fffffffffffffff - lVar20,lVar21) != SBORROW8(lVar45,uVar40)) ==
             (long)(lVar45 - uVar40) < 0;
    if (lVar20 < 0) {
      bVar46 = (SBORROW8(lVar21,lVar36) != SBORROW8(lVar19,(ulong)(uVar32 < -uVar43))) ==
               (long)(lVar19 - (ulong)(uVar32 < -uVar43)) < 0;
    }
    psVar22 = (secp256k1_gej *)(ulong)bVar46;
    if (bVar46 == false) goto LAB_0014bd58;
    a_02 = (secp256k1_gej *)0x7fffffffffffffff;
    uVar40 = uVar32 + uVar43;
    lVar45 = lVar21 + lVar20 + (ulong)CARRY8(uVar32,uVar43);
    uVar1 = (psVar17->x).n[1];
    if (uVar1 != 0) {
      uVar32 = uVar1 * lStack_2a0;
      lVar20 = SUB168(SEXT816((long)uVar1) * SEXT816(lStack_2a0),8);
      uVar43 = (ulong)(-uVar32 - 1 < uVar11);
      lVar19 = (0x7fffffffffffffff - lVar20) - (long)psVar30;
      psVar22 = (secp256k1_gej *)((-0x8000000000000000 - lVar20) - (ulong)(uVar32 != 0));
      bVar46 = (SBORROW8(0x7fffffffffffffff - lVar20,(long)psVar30) != SBORROW8(lVar19,uVar43)) ==
               (long)(lVar19 - uVar43) < 0;
      if (lVar20 < 0) {
        bVar46 = (SBORROW8((long)psVar30,(long)psVar22) !=
                 SBORROW8((long)psVar30 - (long)psVar22,(ulong)(uVar11 < -uVar32))) ==
                 (long)(((long)psVar30 - (long)psVar22) - (ulong)(uVar11 < -uVar32)) < 0;
      }
      psVar18 = psVar23;
      psVar8 = psStack_248;
      if (!bVar46) goto LAB_0014bda3;
      uVar44 = uVar1 * (long)psVar23;
      lVar36 = SUB168(SEXT816((long)uVar1) * SEXT816((long)psVar23),8);
      uVar43 = (ulong)(-uVar44 - 1 < uVar40);
      lVar19 = (0x7fffffffffffffff - lVar36) - lVar45;
      lVar42 = (-0x8000000000000000 - lVar36) - (ulong)(uVar44 != 0);
      lVar21 = lVar45 - lVar42;
      psVar8 = (secp256k1_gej *)(lVar21 - (ulong)(uVar40 < -uVar44));
      bVar46 = (SBORROW8(0x7fffffffffffffff - lVar36,lVar45) != SBORROW8(lVar19,uVar43)) ==
               (long)(lVar19 - uVar43) < 0;
      if (lVar36 < 0) {
        bVar46 = (SBORROW8(lVar45,lVar42) != SBORROW8(lVar21,(ulong)(uVar40 < -uVar44))) ==
                 (long)psVar8 < 0;
      }
      psVar22 = (secp256k1_gej *)(ulong)bVar46;
      if (bVar46 != false) {
        bVar46 = CARRY8(uVar11,uVar32);
        uVar11 = uVar11 + uVar32;
        psVar30 = (secp256k1_gej *)((long)(psVar30->x).n + (ulong)bVar46 + lVar20);
        bVar46 = CARRY8(uVar40,uVar44);
        uVar40 = uVar40 + uVar44;
        lVar45 = lVar45 + lVar36 + (ulong)bVar46;
        goto LAB_0014b677;
      }
      goto LAB_0014bda8;
    }
LAB_0014b677:
    uVar43 = (long)psVar30 << 2 | uVar11 >> 0x3e;
    uVar44 = uStack_2b8 * (long)psStack_260 + uVar43;
    psVar30 = (secp256k1_gej *)
              (((long)psVar30 >> 0x3e) +
               SUB168(SEXT816((long)uStack_2b8) * SEXT816((long)psStack_260),8) +
              (ulong)CARRY8(uStack_2b8 * (long)psStack_260,uVar43));
    uVar32 = (long)psStack_2b0 * uStack_258;
    lVar21 = SUB168(SEXT816((long)psStack_2b0) * SEXT816((long)uStack_258),8);
    uVar43 = (ulong)(-uVar32 - 1 < uVar44);
    lVar19 = (0x7fffffffffffffff - lVar21) - (long)psVar30;
    lVar36 = (-0x8000000000000000 - lVar21) - (ulong)(uVar32 != 0);
    lVar20 = (long)psVar30 - lVar36;
    (psStack_290->x).n[0] = uVar11 & 0x3fffffffffffffff;
    (a_00->x).n[0] = uVar40 & 0x3fffffffffffffff;
    bVar46 = (SBORROW8((long)psVar30,lVar36) != SBORROW8(lVar20,(ulong)(uVar44 < -uVar32))) ==
             (long)(lVar20 - (ulong)(uVar44 < -uVar32)) < 0;
    psVar22 = (secp256k1_gej *)(ulong)bVar46;
    bVar5 = (SBORROW8(0x7fffffffffffffff - lVar21,(long)psVar30) != SBORROW8(lVar19,uVar43)) ==
            (long)(lVar19 - uVar43) < 0;
    if (lVar21 < 0) {
      bVar5 = bVar46;
    }
    psVar18 = psStack_260;
    psVar26 = psStack_290;
    if (!bVar5) goto LAB_0014bd5d;
    uVar40 = uVar40 >> 0x3e | lVar45 << 2;
    uVar33 = uVar44 + uVar32;
    psVar30 = (secp256k1_gej *)((long)(psVar30->x).n + (ulong)CARRY8(uVar44,uVar32) + lVar21);
    uVar11 = uStack_2c8 * (long)psStack_260 + uVar40;
    lVar20 = SUB168(SEXT816((long)uStack_2c8) * SEXT816((long)psStack_260),8) + (lVar45 >> 0x3e) +
             (ulong)CARRY8(uStack_2c8 * (long)psStack_260,uVar40);
    uVar43 = (long)psStack_2c0 * uStack_258;
    lVar19 = SUB168(SEXT816((long)psStack_2c0) * SEXT816((long)uStack_258),8);
    uVar40 = (ulong)(-uVar43 - 1 < uVar11);
    lVar45 = (0x7fffffffffffffff - lVar19) - lVar20;
    psVar18 = (secp256k1_gej *)0x8000000000000000;
    psVar24 = (secp256k1_gej *)((-0x8000000000000000 - lVar19) - (ulong)(uVar43 != 0));
    bVar46 = (SBORROW8(0x7fffffffffffffff - lVar19,lVar20) != SBORROW8(lVar45,uVar40)) ==
             (long)(lVar45 - uVar40) < 0;
    if (lVar19 < 0) {
      bVar46 = (SBORROW8(lVar20,(long)psVar24) !=
               SBORROW8(lVar20 - (long)psVar24,(ulong)(uVar11 < -uVar43))) ==
               (long)((lVar20 - (long)psVar24) - (ulong)(uVar11 < -uVar43)) < 0;
    }
    psVar22 = (secp256k1_gej *)(ulong)bVar46;
    if (bVar46 == false) goto LAB_0014bd62;
    uVar40 = uVar11 + uVar43;
    lVar45 = lVar20 + lVar19 + (ulong)CARRY8(uVar11,uVar43);
    uVar1 = (psVar17->x).n[2];
    if (uVar1 != 0) {
      uVar11 = uVar1 * lStack_2a0;
      lVar20 = SUB168(SEXT816((long)uVar1) * SEXT816(lStack_2a0),8);
      uVar43 = (ulong)(-uVar11 - 1 < uVar33);
      lVar19 = (0x7fffffffffffffff - lVar20) - (long)psVar30;
      psVar22 = (secp256k1_gej *)((-0x8000000000000000 - lVar20) - (ulong)(uVar11 != 0));
      bVar46 = (SBORROW8(0x7fffffffffffffff - lVar20,(long)psVar30) != SBORROW8(lVar19,uVar43)) ==
               (long)(lVar19 - uVar43) < 0;
      if (lVar20 < 0) {
        bVar46 = (SBORROW8((long)psVar30,(long)psVar22) !=
                 SBORROW8((long)psVar30 - (long)psVar22,(ulong)(uVar33 < -uVar11))) ==
                 (long)(((long)psVar30 - (long)psVar22) - (ulong)(uVar33 < -uVar11)) < 0;
      }
      psVar8 = psStack_290;
      if (!bVar46) goto LAB_0014bdad;
      uVar32 = uVar1 * (long)psVar23;
      lVar36 = SUB168(SEXT816((long)uVar1) * SEXT816((long)psVar23),8);
      uVar43 = (ulong)(-uVar32 - 1 < uVar40);
      lVar19 = (0x7fffffffffffffff - lVar36) - lVar45;
      lVar42 = (-0x8000000000000000 - lVar36) - (ulong)(uVar32 != 0);
      lVar21 = lVar45 - lVar42;
      psVar8 = (secp256k1_gej *)
               (ulong)((SBORROW8(lVar45,lVar42) != SBORROW8(lVar21,(ulong)(uVar40 < -uVar32))) ==
                      (long)(lVar21 - (ulong)(uVar40 < -uVar32)) < 0);
      psVar22 = (secp256k1_gej *)
                (ulong)((SBORROW8(0x7fffffffffffffff - lVar36,lVar45) != SBORROW8(lVar19,uVar43)) ==
                       (long)(lVar19 - uVar43) < 0);
      if (lVar36 < 0) {
        psVar22 = psVar8;
      }
      if ((char)psVar22 != '\0') {
        bVar46 = CARRY8(uVar33,uVar11);
        uVar33 = uVar33 + uVar11;
        psVar30 = (secp256k1_gej *)((long)(psVar30->x).n + (ulong)bVar46 + lVar20);
        bVar46 = CARRY8(uVar40,uVar32);
        uVar40 = uVar40 + uVar32;
        lVar45 = lVar45 + lVar36 + (ulong)bVar46;
        goto LAB_0014b871;
      }
      goto LAB_0014bdb2;
    }
LAB_0014b871:
    a_02 = (secp256k1_gej *)0x8000000000000000;
    psVar24 = (secp256k1_gej *)0x7fffffffffffffff;
    uVar43 = (long)psVar30 << 2 | uVar33 >> 0x3e;
    uVar32 = uStack_2b8 * uStack_280 + uVar43;
    psVar30 = (secp256k1_gej *)
              (((long)psVar30 >> 0x3e) +
               SUB168(SEXT816((long)uStack_2b8) * SEXT816((long)uStack_280),8) +
              (ulong)CARRY8(uStack_2b8 * uStack_280,uVar43));
    uVar11 = (long)psStack_2b0 * (long)psStack_268;
    lVar21 = SUB168(SEXT816((long)psStack_2b0) * SEXT816((long)psStack_268),8);
    uVar43 = (ulong)(-uVar11 - 1 < uVar32);
    lVar19 = (0x7fffffffffffffff - lVar21) - (long)psVar30;
    lVar36 = (-0x8000000000000000 - lVar21) - (ulong)(uVar11 != 0);
    lVar20 = (long)psVar30 - lVar36;
    (psStack_290->x).n[1] = uVar33 & 0x3fffffffffffffff;
    (a_00->x).n[1] = uVar40 & 0x3fffffffffffffff;
    bVar46 = (SBORROW8((long)psVar30,lVar36) != SBORROW8(lVar20,(ulong)(uVar32 < -uVar11))) ==
             (long)(lVar20 - (ulong)(uVar32 < -uVar11)) < 0;
    psVar22 = (secp256k1_gej *)(ulong)bVar46;
    bVar5 = (SBORROW8(0x7fffffffffffffff - lVar21,(long)psVar30) != SBORROW8(lVar19,uVar43)) ==
            (long)(lVar19 - uVar43) < 0;
    if (lVar21 < 0) {
      bVar5 = bVar46;
    }
    psVar18 = psStack_268;
    if (!bVar5) goto LAB_0014bd67;
    uVar40 = uVar40 >> 0x3e | lVar45 << 2;
    uVar44 = uVar32 + uVar11;
    psVar30 = (secp256k1_gej *)((long)(psVar30->x).n + (ulong)CARRY8(uVar32,uVar11) + lVar21);
    uVar11 = uStack_2c8 * uStack_280 + uVar40;
    lVar20 = SUB168(SEXT816((long)uStack_2c8) * SEXT816((long)uStack_280),8) + (lVar45 >> 0x3e) +
             (ulong)CARRY8(uStack_2c8 * uStack_280,uVar40);
    uVar43 = (long)psStack_2c0 * (long)psStack_268;
    lVar19 = SUB168(SEXT816((long)psStack_2c0) * SEXT816((long)psStack_268),8);
    uVar40 = (ulong)(-uVar43 - 1 < uVar11);
    lVar45 = (0x7fffffffffffffff - lVar19) - lVar20;
    psVar24 = (secp256k1_gej *)(lVar45 - uVar40);
    psVar18 = (secp256k1_gej *)0x8000000000000000;
    a_02 = (secp256k1_gej *)((-0x8000000000000000 - lVar19) - (ulong)(uVar43 != 0));
    bVar46 = (SBORROW8(0x7fffffffffffffff - lVar19,lVar20) != SBORROW8(lVar45,uVar40)) ==
             (long)psVar24 < 0;
    if (lVar19 < 0) {
      bVar46 = (SBORROW8(lVar20,(long)a_02) !=
               SBORROW8(lVar20 - (long)a_02,(ulong)(uVar11 < -uVar43))) ==
               (long)((lVar20 - (long)a_02) - (ulong)(uVar11 < -uVar43)) < 0;
    }
    psVar22 = (secp256k1_gej *)(ulong)bVar46;
    if (bVar46 == false) goto LAB_0014bd6c;
    uVar40 = uVar11 + uVar43;
    lVar45 = lVar20 + lVar19 + (ulong)CARRY8(uVar11,uVar43);
    uVar1 = (psVar17->x).n[3];
    if (uVar1 == 0) {
LAB_0014ba54:
      a_02 = (secp256k1_gej *)0x8000000000000000;
      uVar43 = (long)psVar30 << 2 | uVar44 >> 0x3e;
      uVar32 = uStack_2b8 * (long)psStack_270 + uVar43;
      psVar30 = (secp256k1_gej *)
                (((long)psVar30 >> 0x3e) +
                 SUB168(SEXT816((long)uStack_2b8) * SEXT816((long)psStack_270),8) +
                (ulong)CARRY8(uStack_2b8 * (long)psStack_270,uVar43));
      uVar11 = (long)psStack_2b0 * (long)psStack_278;
      lVar21 = SUB168(SEXT816((long)psStack_2b0) * SEXT816((long)psStack_278),8);
      uVar43 = (ulong)(-uVar11 - 1 < uVar32);
      lVar19 = (0x7fffffffffffffff - lVar21) - (long)psVar30;
      lVar36 = (-0x8000000000000000 - lVar21) - (ulong)(uVar11 != 0);
      lVar20 = (long)psVar30 - lVar36;
      (psStack_290->x).n[2] = uVar44 & 0x3fffffffffffffff;
      (a_00->x).n[2] = uVar40 & 0x3fffffffffffffff;
      bVar46 = (SBORROW8((long)psVar30,lVar36) != SBORROW8(lVar20,(ulong)(uVar32 < -uVar11))) ==
               (long)(lVar20 - (ulong)(uVar32 < -uVar11)) < 0;
      psVar22 = (secp256k1_gej *)(ulong)bVar46;
      bVar5 = (SBORROW8(0x7fffffffffffffff - lVar21,(long)psVar30) != SBORROW8(lVar19,uVar43)) ==
              (long)(lVar19 - uVar43) < 0;
      if (lVar21 < 0) {
        bVar5 = bVar46;
      }
      psVar18 = psStack_278;
      psVar24 = psStack_270;
      if (!bVar5) goto LAB_0014bd71;
      uVar40 = uVar40 >> 0x3e | lVar45 << 2;
      uVar44 = uVar32 + uVar11;
      psVar30 = (secp256k1_gej *)((long)(psVar30->x).n + (ulong)CARRY8(uVar32,uVar11) + lVar21);
      uVar11 = uStack_2c8 * (long)psStack_270 + uVar40;
      lVar21 = SUB168(SEXT816((long)uStack_2c8) * SEXT816((long)psStack_270),8) + (lVar45 >> 0x3e) +
               (ulong)CARRY8(uStack_2c8 * (long)psStack_270,uVar40);
      uVar43 = (long)psStack_2c0 * (long)psStack_278;
      lVar20 = SUB168(SEXT816((long)psStack_2c0) * SEXT816((long)psStack_278),8);
      uVar40 = (ulong)(-uVar43 - 1 < uVar11);
      lVar45 = (0x7fffffffffffffff - lVar20) - lVar21;
      lVar36 = (-0x8000000000000000 - lVar20) - (ulong)(uVar43 != 0);
      lVar19 = lVar21 - lVar36;
      bVar46 = (SBORROW8(0x7fffffffffffffff - lVar20,lVar21) != SBORROW8(lVar45,uVar40)) ==
               (long)(lVar45 - uVar40) < 0;
      if (lVar20 < 0) {
        bVar46 = (SBORROW8(lVar21,lVar36) != SBORROW8(lVar19,(ulong)(uVar11 < -uVar43))) ==
                 (long)(lVar19 - (ulong)(uVar11 < -uVar43)) < 0;
      }
      psVar22 = (secp256k1_gej *)(ulong)bVar46;
      if (bVar46 == false) goto LAB_0014bd76;
      uVar32 = uVar11 + uVar43;
      lVar19 = lVar21 + lVar20 + (ulong)CARRY8(uVar11,uVar43);
      uVar1 = (psVar17->x).n[4];
      uVar43 = uVar1 * lStack_2a0;
      psVar22 = SUB168(SEXT816((long)uVar1) * SEXT816(lStack_2a0),8);
      uVar40 = (ulong)(-uVar43 - 1 < uVar44);
      lVar45 = (0x7fffffffffffffff - (long)psVar22) - (long)psVar30;
      psVar26 = (secp256k1_gej *)((-0x8000000000000000 - (long)psVar22) - (ulong)(uVar43 != 0));
      bVar46 = (SBORROW8(0x7fffffffffffffff - (long)psVar22,(long)psVar30) !=
               SBORROW8(lVar45,uVar40)) == (long)(lVar45 - uVar40) < 0;
      if ((long)psVar22 < 0) {
        bVar46 = (SBORROW8((long)psVar30,(long)psVar26) !=
                 SBORROW8((long)psVar30 - (long)psVar26,(ulong)(uVar44 < -uVar43))) ==
                 (long)(((long)psVar30 - (long)psVar26) - (ulong)(uVar44 < -uVar43)) < 0;
      }
      if (!bVar46) goto LAB_0014bd7b;
      uVar11 = uVar1 * (long)psVar23;
      lVar20 = SUB168(SEXT816((long)uVar1) * SEXT816((long)psVar23),8);
      psVar24 = (secp256k1_gej *)0x8000000000000000;
      uVar40 = (ulong)(-uVar11 - 1 < uVar32);
      lVar45 = (0x7fffffffffffffff - lVar20) - lVar19;
      a_02 = (secp256k1_gej *)((-0x8000000000000000 - lVar20) - (ulong)(uVar11 != 0));
      bVar46 = (SBORROW8(0x7fffffffffffffff - lVar20,lVar19) != SBORROW8(lVar45,uVar40)) ==
               (long)(lVar45 - uVar40) < 0;
      if (lVar20 < 0) {
        bVar46 = (SBORROW8(lVar19,(long)a_02) !=
                 SBORROW8(lVar19 - (long)a_02,(ulong)(uVar32 < -uVar11))) ==
                 (long)((lVar19 - (long)a_02) - (ulong)(uVar32 < -uVar11)) < 0;
      }
      psVar18 = (secp256k1_gej *)(ulong)bVar46;
      if (bVar46 == false) goto LAB_0014bd80;
      lVar21 = (long)(psVar22->x).n + (ulong)CARRY8(uVar43,uVar44) + (long)(psVar30->x).n;
      lVar45 = lVar20 + lVar19 + (ulong)CARRY8(uVar11,uVar32);
      psVar18 = (secp256k1_gej *)(lVar21 * 4 | uVar43 + uVar44 >> 0x3e);
      (psStack_290->x).n[3] = uVar43 + uVar44 & 0x3fffffffffffffff;
      (a_00->x).n[3] = uVar11 + uVar32 & 0x3fffffffffffffff;
      psVar30 = (secp256k1_gej *)&psVar18[0xd79435e50d7943].x.magnitude;
      psVar22 = (secp256k1_gej *)
                ((lVar21 >> 0x3e) + -1 + (ulong)((secp256k1_gej *)0x7fffffffffffffff < psVar18));
      if (psVar22 != (secp256k1_gej *)0xffffffffffffffff) goto LAB_0014bd85;
      psVar22 = (secp256k1_gej *)0xffffffffffffffff;
      uVar40 = uVar11 + uVar32 >> 0x3e | lVar45 * 4;
      (psStack_290->x).n[4] = (uint64_t)psVar18;
      psVar24 = (secp256k1_gej *)(uVar40 + 0x8000000000000000);
      if ((lVar45 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar40) != -1) goto LAB_0014bd8a;
      (a_00->x).n[4] = uVar40;
      psVar22 = (secp256k1_gej *)0x5;
      psVar18 = (secp256k1_gej *)0xfffffffffffffffe;
      psStack_2d0 = (secp256k1_gej *)0x14bca4;
      psVar30 = psStack_290;
      iVar6 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)psStack_290,5,
                         (secp256k1_modinv64_signed62 *)psVar17,-2);
      if (iVar6 < 1) goto LAB_0014bd8f;
      psVar18 = (secp256k1_gej *)0x1;
      psVar22 = (secp256k1_gej *)0x5;
      psStack_2d0 = (secp256k1_gej *)0x14bcc1;
      psVar30 = psVar27;
      iVar6 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)psVar27,5,
                         (secp256k1_modinv64_signed62 *)psVar17,1);
      if (-1 < iVar6) goto LAB_0014bd94;
      psVar22 = (secp256k1_gej *)0x5;
      psVar18 = (secp256k1_gej *)0xfffffffffffffffe;
      psStack_2d0 = (secp256k1_gej *)0x14bce0;
      psVar30 = a_00;
      iVar6 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)a_00,5,
                         (secp256k1_modinv64_signed62 *)psVar17,-2);
      if (iVar6 < 1) goto LAB_0014bd99;
      psVar18 = (secp256k1_gej *)0x1;
      psVar22 = (secp256k1_gej *)0x5;
      psStack_2d0 = (secp256k1_gej *)0x14bcfd;
      psVar30 = a_00;
      iVar6 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)a_00,5,
                         (secp256k1_modinv64_signed62 *)psVar17,1);
      if (iVar6 < 0) {
        return;
      }
      goto LAB_0014bd9e;
    }
    psVar24 = (secp256k1_gej *)(uVar1 * lStack_2a0);
    lVar20 = SUB168(SEXT816((long)uVar1) * SEXT816(lStack_2a0),8);
    uVar43 = (ulong)(-(long)psVar24 - 1U < uVar44);
    lVar19 = (0x7fffffffffffffff - lVar20) - (long)psVar30;
    a_02 = (secp256k1_gej *)0x8000000000000000;
    psVar22 = (secp256k1_gej *)
              ((-0x8000000000000000 - lVar20) - (ulong)(psVar24 != (secp256k1_gej *)0x0));
    bVar46 = (SBORROW8(0x7fffffffffffffff - lVar20,(long)psVar30) != SBORROW8(lVar19,uVar43)) ==
             (long)(lVar19 - uVar43) < 0;
    if (lVar20 < 0) {
      bVar46 = (SBORROW8((long)psVar30,(long)psVar22) !=
               SBORROW8((long)psVar30 - (long)psVar22,(ulong)(uVar44 < (ulong)-(long)psVar24))) ==
               (long)(((long)psVar30 - (long)psVar22) - (ulong)(uVar44 < (ulong)-(long)psVar24)) < 0
      ;
    }
    psVar8 = psStack_290;
    if (!bVar46) goto LAB_0014bdb7;
    uVar11 = uVar1 * (long)psVar23;
    lVar36 = SUB168(SEXT816((long)uVar1) * SEXT816((long)psVar23),8);
    uVar43 = (ulong)(-uVar11 - 1 < uVar40);
    lVar19 = (0x7fffffffffffffff - lVar36) - lVar45;
    lVar42 = (-0x8000000000000000 - lVar36) - (ulong)(uVar11 != 0);
    lVar21 = lVar45 - lVar42;
    psVar8 = (secp256k1_gej *)(lVar21 - (ulong)(uVar40 < -uVar11));
    bVar46 = (SBORROW8(0x7fffffffffffffff - lVar36,lVar45) != SBORROW8(lVar19,uVar43)) ==
             (long)(lVar19 - uVar43) < 0;
    if (lVar36 < 0) {
      bVar46 = (SBORROW8(lVar45,lVar42) != SBORROW8(lVar21,(ulong)(uVar40 < -uVar11))) ==
               (long)psVar8 < 0;
    }
    uVar7 = (uint)bVar46;
    if (bVar46 != false) {
      bVar46 = CARRY8(uVar44,(ulong)psVar24);
      uVar44 = (long)(psVar24->x).n + uVar44;
      psVar30 = (secp256k1_gej *)((long)(psVar30->x).n + (ulong)bVar46 + lVar20);
      bVar46 = CARRY8(uVar40,uVar11);
      uVar40 = uVar40 + uVar11;
      lVar45 = lVar45 + lVar36 + (ulong)bVar46;
      goto LAB_0014ba54;
    }
  }
  psStack_2d0 = (secp256k1_gej *)secp256k1_modinv64_mul_cmp_62;
  secp256k1_modinv64_update_de_62_cold_18();
  a_03 = &sStack_330;
  psStack_2e0 = psVar24;
  psStack_2d8 = a_02;
  psStack_2d0 = psVar8;
  secp256k1_modinv64_mul_62(&sStack_308,(secp256k1_modinv64_signed62 *)psVar30,uVar7,1);
  psVar28 = a;
  secp256k1_modinv64_mul_62(&sStack_330,a,5,(int64_t)psVar23);
  lVar45 = 0;
  while ((ulong)sStack_308.v[lVar45] < 0x4000000000000000) {
    if (0x3fffffffffffffff < (ulong)sStack_330.v[lVar45]) goto LAB_0014be51;
    lVar45 = lVar45 + 1;
    if (lVar45 == 4) {
      uVar7 = 4;
      while( true ) {
        if (sStack_308.v[uVar7] < sStack_330.v[uVar7]) {
          return;
        }
        if (sStack_330.v[uVar7] < sStack_308.v[uVar7]) break;
        bVar46 = uVar7 == 0;
        uVar7 = uVar7 - 1;
        if (bVar46) {
          return;
        }
      }
      return;
    }
  }
  secp256k1_modinv64_mul_cmp_62_cold_2();
LAB_0014be51:
  secp256k1_modinv64_mul_cmp_62_cold_1();
  iVar6 = (int)a_03;
  if (iVar6 < 1) {
LAB_0014c110:
    secp256k1_modinv64_update_fg_62_var_cold_9();
LAB_0014c115:
    secp256k1_modinv64_update_fg_62_var_cold_1();
LAB_0014c11a:
    secp256k1_modinv64_update_fg_62_var_cold_2();
LAB_0014c11f:
    secp256k1_modinv64_update_fg_62_var_cold_3();
LAB_0014c124:
    secp256k1_modinv64_update_fg_62_var_cold_4();
LAB_0014c129:
    secp256k1_modinv64_update_fg_62_var_cold_8();
  }
  else {
    uVar1 = (psVar23->x).n[0];
    uVar2 = (psVar23->x).n[1];
    lVar45 = psVar28->v[0];
    lVar19 = *extraout_RDX_00;
    uVar40 = lVar45 * uVar1;
    lVar21 = SUB168(SEXT816(lVar45) * SEXT816((long)uVar1),8);
    uVar43 = lVar19 * uVar2;
    lVar36 = SUB168(SEXT816(lVar19) * SEXT816((long)uVar2),8);
    lVar20 = (0x7fffffffffffffff - lVar36) - lVar21;
    if (-1 < lVar36 &&
        (SBORROW8(0x7fffffffffffffff - lVar36,lVar21) != SBORROW8(lVar20,(ulong)(~uVar43 < uVar40)))
        != (long)(lVar20 - (ulong)(~uVar43 < uVar40)) < 0) goto LAB_0014c115;
    uVar3 = (psVar23->x).n[2];
    lVar21 = lVar36 + lVar21 + (ulong)CARRY8(uVar43,uVar40);
    uVar4 = (psVar23->x).n[3];
    uVar32 = lVar45 * uVar3;
    lVar20 = SUB168(SEXT816(lVar45) * SEXT816((long)uVar3),8);
    uVar44 = lVar19 * uVar4;
    lVar19 = SUB168(SEXT816(lVar19) * SEXT816((long)uVar4),8);
    uVar11 = (ulong)(-uVar44 - 1 < uVar32);
    lVar45 = (0x7fffffffffffffff - lVar19) - lVar20;
    if (-1 < lVar19 &&
        (SBORROW8(0x7fffffffffffffff - lVar19,lVar20) != SBORROW8(lVar45,uVar11)) !=
        (long)(lVar45 - uVar11) < 0) goto LAB_0014c11a;
    lVar45 = lVar19 + lVar20 + (ulong)CARRY8(uVar44,uVar32);
    if ((uVar43 + uVar40 & 0x3fffffffffffffff) != 0) goto LAB_0014c11f;
    if ((uVar44 + uVar32 & 0x3fffffffffffffff) != 0) goto LAB_0014c124;
    uVar11 = uVar44 + uVar32 >> 0x3e | lVar45 * 4;
    uVar40 = uVar43 + uVar40 >> 0x3e | lVar21 * 4;
    lVar45 = lVar45 >> 0x3e;
    lVar21 = lVar21 >> 0x3e;
    if (iVar6 != 1) {
      psVar12 = (secp256k1_modinv64_signed62 *)((ulong)a_03 & 0xffffffff);
      a_03 = (secp256k1_modinv64_signed62 *)0x1;
      do {
        lVar19 = psVar28->v[(long)a_03];
        uVar32 = lVar19 * uVar1 + uVar40;
        lVar25 = SUB168(SEXT816(lVar19) * SEXT816((long)uVar1),8) + lVar21 +
                 (ulong)CARRY8(lVar19 * uVar1,uVar40);
        lVar20 = extraout_RDX_00[(long)a_03];
        uVar43 = lVar20 * uVar2;
        lVar42 = SUB168(SEXT816(lVar20) * SEXT816((long)uVar2),8);
        uVar40 = (ulong)(-uVar43 - 1 < uVar32);
        lVar21 = (0x7fffffffffffffff - lVar42) - lVar25;
        psVar29 = (secp256k1_modinv64_signed62 *)0x8000000000000000;
        lVar39 = (-0x8000000000000000 - lVar42) - (ulong)(uVar43 != 0);
        lVar36 = lVar25 - lVar39;
        bVar46 = (SBORROW8(0x7fffffffffffffff - lVar42,lVar25) != SBORROW8(lVar21,uVar40)) ==
                 (long)(lVar21 - uVar40) < 0;
        if (lVar42 < 0) {
          bVar46 = (SBORROW8(lVar25,lVar39) != SBORROW8(lVar36,(ulong)(uVar32 < -uVar43))) ==
                   (long)(lVar36 - (ulong)(uVar32 < -uVar43)) < 0;
        }
        if (!bVar46) {
          secp256k1_modinv64_update_fg_62_var_cold_5();
LAB_0014c10b:
          psVar28 = psVar29;
          secp256k1_modinv64_update_fg_62_var_cold_6();
          goto LAB_0014c110;
        }
        uVar33 = lVar19 * uVar3 + uVar11;
        lVar36 = SUB168(SEXT816(lVar19) * SEXT816((long)uVar3),8) + lVar45 +
                 (ulong)CARRY8(lVar19 * uVar3,uVar11);
        uVar44 = lVar20 * uVar4;
        lVar20 = SUB168(SEXT816(lVar20) * SEXT816((long)uVar4),8);
        uVar40 = (ulong)(-uVar44 - 1 < uVar33);
        lVar45 = (0x7fffffffffffffff - lVar20) - lVar36;
        lVar21 = (-0x8000000000000000 - lVar20) - (ulong)(uVar44 != 0);
        lVar19 = lVar36 - lVar21;
        bVar46 = (SBORROW8(0x7fffffffffffffff - lVar20,lVar36) != SBORROW8(lVar45,uVar40)) ==
                 (long)(lVar45 - uVar40) < 0;
        if (lVar20 < 0) {
          bVar46 = (SBORROW8(lVar36,lVar21) != SBORROW8(lVar19,(ulong)(uVar33 < -uVar44))) ==
                   (long)(lVar19 - (ulong)(uVar33 < -uVar44)) < 0;
        }
        if (!bVar46) goto LAB_0014c10b;
        lVar21 = lVar42 + lVar25 + (ulong)CARRY8(uVar43,uVar32);
        lVar45 = lVar20 + lVar36 + (ulong)CARRY8(uVar44,uVar33);
        uVar40 = lVar21 * 4 | uVar43 + uVar32 >> 0x3e;
        psVar28->v[(long)((long)a_03[-1].v + 0x27)] = uVar43 + uVar32 & 0x3fffffffffffffff;
        uVar11 = lVar45 * 4 | uVar44 + uVar33 >> 0x3e;
        extraout_RDX_00[(long)((long)a_03[-1].v + 0x27)] = uVar44 + uVar33 & 0x3fffffffffffffff;
        a_03 = (secp256k1_modinv64_signed62 *)((long)a_03->v + 1);
        lVar45 = lVar45 >> 0x3e;
        lVar21 = lVar21 >> 0x3e;
      } while (psVar12 != a_03);
    }
    if (lVar21 + -1 + (ulong)(0x7fffffffffffffff < uVar40) != -1) goto LAB_0014c129;
    psVar28->v[(long)iVar6 + -1] = uVar40;
    if (lVar45 + -1 + (ulong)(0x7fffffffffffffff < uVar11) == -1) {
      extraout_RDX_00[(long)iVar6 + -1] = uVar11;
      return;
    }
  }
  secp256k1_modinv64_update_fg_62_var_cold_7();
  lVar45 = a_03->v[0];
  lVar19 = a_03->v[1];
  lVar20 = a_03->v[2];
  lVar21 = a_03->v[3];
  lVar36 = a_03->v[4];
  lVar42 = 0;
  do {
    if (a_03->v[lVar42] < -0x3fffffffffffffff) {
      secp256k1_modinv64_normalize_62_cold_7();
LAB_0014c35f:
      secp256k1_modinv64_normalize_62_cold_6();
      goto LAB_0014c364;
    }
    if (0x3fffffffffffffff < a_03->v[lVar42]) goto LAB_0014c35f;
    lVar42 = lVar42 + 1;
  } while (lVar42 != 5);
  iVar6 = secp256k1_modinv64_mul_cmp_62(a_03,5,b,-2);
  if (iVar6 < 1) {
LAB_0014c364:
    secp256k1_modinv64_normalize_62_cold_5();
LAB_0014c369:
    secp256k1_modinv64_normalize_62_cold_4();
LAB_0014c36e:
    secp256k1_modinv64_normalize_62_cold_3();
  }
  else {
    iVar6 = secp256k1_modinv64_mul_cmp_62(a_03,5,b,1);
    if (-1 < iVar6) goto LAB_0014c369;
    uVar40 = lVar36 >> 0x3f;
    uVar32 = (long)psVar28 >> 0x3f;
    uVar43 = ((uVar40 & b->v[0]) + lVar45 ^ uVar32) - uVar32;
    uVar44 = ((long)uVar43 >> 0x3e) + (((uVar40 & b->v[1]) + lVar19 ^ uVar32) - uVar32);
    uVar33 = ((long)uVar44 >> 0x3e) + ((lVar20 + (uVar40 & b->v[2]) ^ uVar32) - uVar32);
    uVar11 = ((long)uVar33 >> 0x3e) + (((uVar40 & b->v[3]) + lVar21 ^ uVar32) - uVar32);
    lVar45 = ((long)uVar11 >> 0x3e) + (((uVar40 & b->v[4]) + lVar36 ^ uVar32) - uVar32);
    uVar32 = lVar45 >> 0x3f;
    uVar40 = (b->v[0] & uVar32) + (uVar43 & 0x3fffffffffffffff);
    uVar44 = ((long)uVar40 >> 0x3e) + (b->v[1] & uVar32) + (uVar44 & 0x3fffffffffffffff);
    uVar43 = ((long)uVar44 >> 0x3e) + (b->v[2] & uVar32) + (uVar33 & 0x3fffffffffffffff);
    uVar11 = ((long)uVar43 >> 0x3e) + (b->v[3] & uVar32) + (uVar11 & 0x3fffffffffffffff);
    uVar32 = (b->v[4] & uVar32) + lVar45 + ((long)uVar11 >> 0x3e);
    a_03->v[0] = uVar40 & 0x3fffffffffffffff;
    a_03->v[1] = uVar44 & 0x3fffffffffffffff;
    a_03->v[2] = uVar43 & 0x3fffffffffffffff;
    a_03->v[3] = uVar11 & 0x3fffffffffffffff;
    a_03->v[4] = uVar32;
    if (0x3fffffffffffffff < uVar32) goto LAB_0014c36e;
    iVar6 = secp256k1_modinv64_mul_cmp_62(a_03,5,b,0);
    if (-1 < iVar6) {
      iVar6 = secp256k1_modinv64_mul_cmp_62(a_03,5,b,1);
      if (iVar6 < 0) {
        return;
      }
      goto LAB_0014c378;
    }
  }
  secp256k1_modinv64_normalize_62_cold_2();
LAB_0014c378:
  secp256k1_modinv64_normalize_62_cold_1();
  return;
}

Assistant:

static void secp256k1_scalar_inverse_var(secp256k1_scalar *r, const secp256k1_scalar *x) {
    secp256k1_modinv64_signed62 s;
#ifdef VERIFY
    int zero_in = secp256k1_scalar_is_zero(x);
#endif
    SECP256K1_SCALAR_VERIFY(x);

    secp256k1_scalar_to_signed62(&s, x);
    secp256k1_modinv64_var(&s, &secp256k1_const_modinfo_scalar);
    secp256k1_scalar_from_signed62(r, &s);

    SECP256K1_SCALAR_VERIFY(r);
    VERIFY_CHECK(secp256k1_scalar_is_zero(r) == zero_in);
}